

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteTypes(WatWriter *this,TypeVector *types,char *name)

{
  Type *pTVar1;
  char *extraout_RDX;
  char *pcVar2;
  char *extraout_RDX_00;
  Type *pTVar3;
  
  if ((types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    pcVar2 = name;
    if (name != (char *)0x0) {
      WritePuts(this,"(",None);
      WritePuts(this,name,Space);
      this->indent_ = this->indent_ + 2;
      pcVar2 = extraout_RDX;
    }
    pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
      WriteType(this,*pTVar3,(NextChar)pcVar2);
      pcVar2 = extraout_RDX_00;
    }
    if (name != (char *)0x0) {
      WriteClose(this,Space);
      return;
    }
  }
  return;
}

Assistant:

void WatWriter::WriteTypes(const TypeVector& types, const char* name) {
  if (types.size()) {
    if (name) {
      WriteOpenSpace(name);
    }
    for (Type type : types) {
      WriteType(type, NextChar::Space);
    }
    if (name) {
      WriteCloseSpace();
    }
  }
}